

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

void __thiscall
mjs::global_object::validate_type
          (global_object *this,value *v,object_ptr *expected_prototype,char *expected_type)

{
  char *pcVar1;
  void *pvVar2;
  void *pvVar3;
  wostream *pwVar4;
  native_error_exception *this_00;
  object_ptr p;
  object_ptr oval;
  wostringstream woss;
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  wstring local_1d8;
  wstring_view local_1b8;
  wostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  if (v->type_ == object) {
    local_1d8._M_dataplus._M_p =
         (pointer)(v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_1d8._M_string_length._0_4_ = *(undefined4 *)((long)&v->field_1 + 8);
    if ((gc_heap *)local_1d8._M_dataplus._M_p != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_1d8._M_dataplus._M_p,(gc_heap_ptr_untyped *)&local_1d8);
    }
    if ((gc_heap *)local_1d8._M_dataplus._M_p == (gc_heap *)0x0) {
      __assert_fail("oval",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0x323,
                    "void mjs::global_object::validate_type(const value &, const object_ptr &, const char *) const"
                   );
    }
    pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_1d8);
    if (*(int *)((long)pvVar2 + 0x14) == 0) {
      local_1f8._0_8_ = (gc_heap *)0x0;
      local_1f8._8_4_ = 0;
    }
    else {
      gc_heap::unsafe_create_from_position<mjs::object>
                ((gc_heap *)local_1f8,(uint32_t)*(undefined8 *)((long)pvVar2 + 8));
    }
    if ((gc_heap *)local_1f8._0_8_ != (gc_heap *)0x0) {
      pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1f8);
      pvVar3 = gc_heap_ptr_untyped::get(&expected_prototype->super_gc_heap_ptr_untyped);
      if (pvVar2 == pvVar3) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1f8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1d8);
        std::__cxx11::wostringstream::~wostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
    }
    if (v->type_ != object) {
      __assert_fail("type_ == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x46,"const object_ptr &mjs::value::object_value() const");
    }
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(v->field_1).s_);
    object::class_name((object *)local_208);
    mjs::operator<<((wostream *)local_1a8,(string *)local_208);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_208);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1d8);
  }
  else {
    debug_print((wostream *)local_1a8,v,2,1,0);
  }
  pwVar4 = std::operator<<((wostream *)local_1a8," is not a");
  pvVar2 = memchr("aeiou",(int)*expected_type,6);
  pcVar1 = "\\n";
  if (pvVar2 == (void *)0x0) {
    pcVar1 = "\t";
  }
  pwVar4 = std::operator<<(pwVar4,pcVar1 + 1);
  pwVar4 = std::operator<<(pwVar4," ");
  std::operator<<(pwVar4,expected_type);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1d8,this);
  local_208._0_8_ =
       CONCAT44(local_1d8._M_string_length._4_4_,(undefined4)local_1d8._M_string_length);
  local_208._8_8_ = local_1d8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b8._M_len = CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
  local_1b8._M_str = (wchar_t *)local_1f8._0_8_;
  native_error_exception::native_error_exception(this_00,type,(wstring_view *)local_208,&local_1b8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void global_object::validate_type(const value& v, const object_ptr& expected_prototype, const char* expected_type) const {
    std::wostringstream woss;
    if (v.type() == value_type::object) {
        auto oval = v.object_value();
        assert(oval);
        auto p = oval->prototype();
        if (p && p.get() == expected_prototype.get()) {
            return;
        }
        woss << v.object_value()->class_name();
    } else {
        mjs::debug_print(woss, v, 2, 1);
    }
    woss << " is not a" << (strchr("aeiou", expected_type[0]) ? "n" : "") << " " << expected_type;
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}